

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

avector<Vec3fa> * __thiscall
embree::XMLLoader::loadVec3faArray
          (avector<Vec3fa> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 uVar1;
  XML *this_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  bool bVar4;
  size_t sVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar6;
  ulong uVar7;
  size_t *psVar8;
  runtime_error *this_01;
  long lVar9;
  ulong uVar10;
  float fVar11;
  allocator local_a9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_a8;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> temp;
  string local_78;
  float local_58;
  float local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (Vec3fa *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_78,"ofs",&local_a9);
    XML::parm((string *)&temp,this_00,&local_78);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &temp,"");
    std::__cxx11::string::~string((string *)&temp);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar4) {
      loadBinary<std::vector<embree::Vec3<float>,std::allocator<embree::Vec3<float>>>>
                (&temp,this,xml);
      psVar8 = &__return_storage_ptr__->size_active;
      __return_storage_ptr__->items = (Vec3fa *)0x0;
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      sVar5 = ((long)temp.
                     super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)temp.
                    super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc;
      if (temp.super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          temp.super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        paVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0x0;
      }
      else {
        paVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)alignedMalloc(sVar5 << 4,0x10);
        __return_storage_ptr__->items = (Vec3fa *)paVar6;
        alignedFree((void *)0x0);
        *psVar8 = sVar5;
        psVar8 = &__return_storage_ptr__->size_alloced;
      }
      *psVar8 = sVar5;
      lVar9 = 4;
      for (uVar10 = 0;
          uVar10 < (ulong)(((long)temp.
                                  super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)temp.
                                 super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc);
          uVar10 = uVar10 + 1) {
        uVar1 = *(undefined8 *)
                 ((long)&(temp.
                          super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar9);
        aVar3.m128[1] = (float)(int)uVar1;
        aVar3.m128[0] =
             (float)*(undefined4 *)
                     ((long)temp.
                            super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar9 + -4);
        aVar3.m128[2] = (float)(int)((ulong)uVar1 >> 0x20);
        aVar3.m128[3] = 0.0;
        *paVar6 = aVar3;
        lVar9 = lVar9 + 0xc;
        paVar6 = paVar6 + 1;
      }
      std::_Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::~_Vector_base
                (&temp.
                  super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>);
    }
    else {
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (Vec3fa *)0x0;
      uVar10 = ((long)(xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(xml->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x48;
      uVar7 = uVar10 / 3;
      if (uVar10 % 3 != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_78,&xml->ptr->loc);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                       &local_78,": wrong vector<float3> body");
        std::runtime_error::runtime_error(this_01,(string *)&temp);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar10 < 3) {
        paVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0x0;
        psVar8 = &__return_storage_ptr__->size_active;
      }
      else {
        paVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)alignedMalloc(uVar7 << 4,0x10);
        __return_storage_ptr__->items = (Vec3fa *)paVar6;
        alignedFree((void *)0x0);
        psVar8 = &__return_storage_ptr__->size_alloced;
        __return_storage_ptr__->size_active = uVar7;
      }
      *psVar8 = uVar7;
      lVar9 = 0x90;
      local_a8 = paVar6;
      while (bVar4 = uVar7 != 0, uVar7 = uVar7 - 1, bVar4) {
        local_48 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-2].ty +
                                         lVar9),true);
        local_58 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].ty +
                                         lVar9),true);
        fVar11 = Token::Float((Token *)((long)&((xml->ptr->body).
                                                super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->ty +
                                       lVar9),true);
        aVar2.m128[1] = local_58;
        aVar2.m128[0] = local_48;
        aVar2.m128[2] = fVar11;
        aVar2.m128[3] = 0.0;
        *paVar6 = aVar2;
        paVar6 = paVar6 + 1;
        lVar9 = lVar9 + 0xd8;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

avector<Vec3fa> XMLLoader::loadVec3faArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<Vec3fa>();

    if (xml->parm("ofs") != "") {
      std::vector<Vec3f> temp = loadBinary<std::vector<Vec3f>>(xml);
      avector<Vec3fa> data; data.resize(temp.size());
      for (size_t i=0; i<temp.size(); i++) data[i] = Vec3fa(temp[i]);
      return data;
    } 
    else 
    {
      avector<Vec3fa> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3fa(xml->body[3*i+0].Float(),xml->body[3*i+1].Float(),xml->body[3*i+2].Float());
      return data;
    }
  }